

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O0

long Eigen::internal::first_aligned<16,double,long>(double *array,long size)

{
  double *pdVar1;
  double *local_48;
  long first;
  long AlignmentMask;
  long AlignmentSize;
  long ScalarSize;
  long size_local;
  double *array_local;
  
  array_local = (double *)size;
  if (((ulong)array & 7) == 0) {
    pdVar1 = (double *)(2 - ((ulong)array >> 3 & 1) & 1);
    local_48 = (double *)size;
    if ((long)pdVar1 < size) {
      local_48 = pdVar1;
    }
    array_local = local_48;
  }
  return (long)array_local;
}

Assistant:

EIGEN_DEVICE_FUNC inline Index first_aligned(const Scalar* array, Index size)
{
  const Index ScalarSize = sizeof(Scalar);
  const Index AlignmentSize = Alignment / ScalarSize;
  const Index AlignmentMask = AlignmentSize-1;

  if(AlignmentSize<=1)
  {
    // Either the requested alignment if smaller than a scalar, or it exactly match a 1 scalar
    // so that all elements of the array have the same alignment.
    return 0;
  }
  else if( (UIntPtr(array) & (sizeof(Scalar)-1)) || (Alignment%ScalarSize)!=0)
  {
    // The array is not aligned to the size of a single scalar, or the requested alignment is not a multiple of the scalar size.
    // Consequently, no element of the array is well aligned.
    return size;
  }
  else
  {
    Index first = (AlignmentSize - (Index((UIntPtr(array)/sizeof(Scalar))) & AlignmentMask)) & AlignmentMask;
    return (first < size) ? first : size;
  }
}